

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void array_run_container_union(array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  rle16_t *prVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  rle16_t local_34;
  
  _Var3 = run_container_is_full(src_2);
  if (_Var3) {
    run_container_copy(src_2,dst);
    return;
  }
  run_container_grow(dst,(src_2->n_runs + src_1->cardinality) * 2,false);
  bVar2 = src_2->runs->value <= *src_1->array;
  if (bVar2) {
    dst->runs[dst->n_runs] = *src_2->runs;
    iVar4 = dst->n_runs;
  }
  else {
    prVar1 = dst->runs;
    iVar4 = dst->n_runs;
    prVar1[iVar4].value = *src_1->array;
    prVar1[iVar4].length = 0;
  }
  uVar8 = (ulong)!bVar2;
  uVar6 = (ulong)bVar2;
  dst->n_runs = iVar4 + 1;
  do {
    uVar6 = (ulong)(int)uVar6;
    while( true ) {
      iVar4 = src_2->n_runs;
      iVar5 = src_1->cardinality;
      iVar7 = (int)uVar8;
      if ((iVar4 <= (int)uVar6) || (iVar5 <= iVar7)) {
        if (iVar7 < iVar5) {
          for (; (long)uVar8 < (long)iVar5; uVar8 = uVar8 + 1) {
            run_container_append_value(dst,src_1->array[uVar8],&local_34);
            iVar5 = src_1->cardinality;
          }
        }
        else {
          for (; (long)uVar6 < (long)iVar4; uVar6 = uVar6 + 1) {
            run_container_append(dst,src_2->runs[uVar6],&local_34);
            iVar4 = src_2->n_runs;
          }
        }
        return;
      }
      if (src_1->array[uVar8] < src_2->runs[uVar6].value) break;
      run_container_append(dst,src_2->runs[uVar6],&local_34);
      uVar6 = uVar6 + 1;
    }
    run_container_append_value(dst,src_1->array[uVar8],&local_34);
    uVar8 = (ulong)(iVar7 + 1);
  } while( true );
}

Assistant:

void array_run_container_union(const array_container_t *src_1,
                               const run_container_t *src_2,
                               run_container_t *dst) {
    if (run_container_is_full(src_2)) {
        run_container_copy(src_2, dst);
        return;
    }
    // TODO: see whether the "2*" is spurious
    run_container_grow(dst, 2 * (src_1->cardinality + src_2->n_runs), false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t previousrle;
    if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(dst, src_2->runs[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(dst, src_1->array[arraypos]);
        arraypos++;
    }
    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(dst, src_2->runs[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(dst, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(dst, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src_2->n_runs) {
            run_container_append(dst, src_2->runs[rlepos], &previousrle);
            rlepos++;
        }
    }
}